

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O2

int __thiscall jrtplib::RTPTCPTransmitter::AbortWait(RTPTCPTransmitter *this)

{
  int iVar1;
  
  iVar1 = -0xb5;
  if (((this->m_init == true) && (iVar1 = -0xbb, this->m_created == true)) &&
     (iVar1 = -0xc1, this->m_waitingForData == true)) {
    RTPAbortDescriptors::SendAbortSignal(this->m_pAbortDesc);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int RTPTCPTransmitter::AbortWait()
{
	if (!m_init)
		return ERR_RTP_TCPTRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	if (!m_created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOTCREATED;
	}
	if (!m_waitingForData)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOTWAITING;
	}

	m_pAbortDesc->SendAbortSignal();
	
	MAINMUTEX_UNLOCK
	return 0;
}